

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

void Str_NtkBalanceMux(Gia_Man_t *pNew,Str_Ntk_t *p,Str_Obj_t *pObj,Vec_Int_t *vDelay,int nLutSize,
                      int nGroups,int nMuxes,int fRecursive,int fOptArea,int fVerbose)

{
  int iVar1;
  int iLit1;
  int iLit0;
  int fUseRestruct;
  int iRes;
  int m;
  int n;
  int nGroups_local;
  int nLutSize_local;
  Vec_Int_t *vDelay_local;
  Str_Obj_t *pObj_local;
  Str_Ntk_t *p_local;
  Gia_Man_t *pNew_local;
  
  vDelay_local = (Vec_Int_t *)pObj;
  for (iRes = 0; iRes < nGroups; iRes = iRes + 1) {
    iVar1 = Str_ObjId(p,(Str_Obj_t *)vDelay_local);
    iVar1 = Str_MuxRestructure(pNew,p,iVar1,nMuxes,vDelay,nLutSize,fRecursive,fOptArea,fVerbose);
    if (iVar1 == -1) {
      for (fUseRestruct = 0; fUseRestruct < nMuxes; fUseRestruct = fUseRestruct + 1) {
        iVar1 = Str_ObjFaninCopy(p,(Str_Obj_t *)vDelay_local,2);
        iLit1 = Str_ObjFaninCopy(p,(Str_Obj_t *)vDelay_local,1);
        iLit0 = Str_ObjFaninCopy(p,(Str_Obj_t *)vDelay_local,0);
        iVar1 = Gia_ManHashMuxReal(pNew,iVar1,iLit1,iLit0);
        *(int *)((long)&vDelay_local->pArray + 4) = iVar1;
        iVar1 = Abc_Lit2Var(*(int *)((long)&vDelay_local->pArray + 4));
        Str_ObjDelay(pNew,iVar1,nLutSize,vDelay);
        vDelay_local = vDelay_local + 1;
      }
    }
    else {
      *(int *)((long)&vDelay_local[nMuxes + -1].pArray + 4) = iVar1;
      vDelay_local = vDelay_local + (long)(nMuxes + -1) + 1;
    }
  }
  return;
}

Assistant:

void Str_NtkBalanceMux( Gia_Man_t * pNew, Str_Ntk_t * p, Str_Obj_t * pObj, Vec_Int_t * vDelay, int nLutSize, int nGroups, int nMuxes, int fRecursive, int fOptArea, int fVerbose )
{
    extern int Str_MuxRestructure( Gia_Man_t * pNew, Str_Ntk_t * pNtk, int iMux, int nMuxes, Vec_Int_t * vDelay, int nLutSize, int fRecursive, int fOptArea, int fVerbose );
    int n, m, iRes, fUseRestruct = 1;
    if ( fUseRestruct )
    {
        for ( n = 0; n < nGroups; n++ )
        {            
            iRes = Str_MuxRestructure( pNew, p, Str_ObjId(p, pObj), nMuxes, vDelay, nLutSize, fRecursive, fOptArea, fVerbose );
            if ( iRes == -1 )
            {
                for ( m = 0; m < nMuxes; m++, pObj++ )
                {
                    pObj->iCopy = Gia_ManHashMuxReal( pNew, Str_ObjFaninCopy(p, pObj, 2), Str_ObjFaninCopy(p, pObj, 1), Str_ObjFaninCopy(p, pObj, 0) );
                    Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
                }
            }
            else
            {
                pObj += nMuxes - 1;
                pObj->iCopy = iRes;
                pObj++;
            }
        }
    }
    else
    {
        for ( n = 0; n < nGroups * nMuxes; n++, pObj++ )
        {
            pObj->iCopy = Gia_ManHashMuxReal( pNew, Str_ObjFaninCopy(p, pObj, 2), Str_ObjFaninCopy(p, pObj, 1), Str_ObjFaninCopy(p, pObj, 0) );
            Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
        }
    }
}